

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Promise<void> __thiscall kj::TaskSet::onEmpty(TaskSet *this)

{
  SourceLocation location;
  bool bVar1;
  uint uVar2;
  Exception *this_00;
  PromiseFulfiller<void> *pPVar3;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar4;
  long in_RSI;
  undefined8 in_stack_ffffffffffffff50;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_88;
  SourceLocation local_70;
  undefined1 local_58 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_30;
  Fault f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *fulfiller;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_fulfiller393;
  TaskSet *this_local;
  
  this_00 = (Exception *)
            kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                      ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                       (in_RSI + 0x10));
  if (this_00 != (Exception *)0x0) {
    f.exception = this_00;
    pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                       ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)this_00);
    uVar2 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
    if ((uVar2 & 1) != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x18b,FAILED,(char *)0x0,"\"onEmpty() can only be called once at a time\"",
                 (char (*) [44])"onEmpty() can only be called once at a time");
      kj::_::Debug::Fault::fatal(&local_30);
    }
  }
  bVar1 = Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::operator==
                    ((Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)(in_RSI + 8));
  if (bVar1) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    SourceLocation::SourceLocation
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,"onEmpty",0x192,0x10);
    location.function = (char *)local_70._16_8_;
    location.fileName = local_70.function;
    location.lineNumber = (int)in_stack_ffffffffffffff50;
    location.columnNumber = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    newPromiseAndFulfiller<void>(location);
    t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                  ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&local_88,t);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x10),
               &local_88);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_88);
    pPVar4 = mv<kj::Promise<void>>((Promise<void> *)local_58);
    Promise<void>::Promise((Promise<void> *)this,pPVar4);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_58);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> TaskSet::onEmpty() {
  KJ_IF_SOME(fulfiller, emptyFulfiller) {
    if (fulfiller->isWaiting()) {
      KJ_FAIL_REQUIRE("onEmpty() can only be called once at a time");
    }
  }

  if (tasks == kj::none) {
    return READY_NOW;
  } else {
    auto paf = newPromiseAndFulfiller<void>();
    emptyFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}